

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_msg.c
# Opt level: O0

void setup_pipe(void)

{
  if (send_file1 == (FILE *)0x0) {
    send_file1 = open_tmp_file(&send_file1_name);
    if (send_file1 == (FILE *)0x0) {
      eprintf("Unable to create temporary file for communication; may not have permissions to do so"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_msg.c"
              ,0x13d);
    }
  }
  else {
    if (send_file2 != (FILE *)0x0) {
      eprintf("Only one nesting of suite runs supported",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_msg.c"
              ,0x14d);
    }
    send_file2 = open_tmp_file(&send_file2_name);
    if (send_file2 == (FILE *)0x0) {
      eprintf("Unable to create temporary file for communication; may not have permissions to do so"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_msg.c"
              ,0x146);
    }
  }
  return;
}

Assistant:

static void setup_pipe(void)
{
    if(send_file1 == NULL)
    {
        send_file1 = open_tmp_file(&send_file1_name);
        if(send_file1 == NULL)
        {
            eprintf("Unable to create temporary file for communication; may not have permissions to do so", __FILE__, __LINE__ -3);
        }
        return;
    }
    if(send_file2 == NULL)
    {
        send_file2 = open_tmp_file(&send_file2_name);
        if(send_file2 == NULL)
        {
            eprintf("Unable to create temporary file for communication; may not have permissions to do so", __FILE__, __LINE__ -3);
        }
        return;
    }
    eprintf("Only one nesting of suite runs supported", __FILE__, __LINE__);
}